

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool findKeyPresses<stSampleMulti<short,4>>
               (TWaveformViewT<TSampleMI16> *waveform,TKeyPressCollectionT<TSampleMI16> *res,
               TWaveformT<TSampleMI16> *waveformThreshold,TWaveformT<TSampleMI16> *waveformMax,
               double thresholdBackground,int historySize,int historySizeReset,bool removeLowPower)

{
  pointer *ppsVar1;
  short sVar2;
  short sVar3;
  stSampleMulti<short,_4> *psVar4;
  size_type __n;
  iterator iVar5;
  pointer psVar6;
  TKeyPressPosition TVar7;
  TValueCC TVar8;
  int64_t iVar9;
  TKey TVar10;
  TKey TVar11;
  undefined4 uVar12;
  long lVar13;
  long *plVar14;
  pointer psVar15;
  size_type sVar16;
  long *plVar17;
  long *plVar18;
  pointer psVar19;
  stKeyPressData<stSampleMulti<short,_4>_> *psVar20;
  TKeyPressCollectionT<TSampleMI16> *__range3;
  iterator __end3;
  _Elt_pointer plVar21;
  long *plVar22;
  long lVar23;
  int iVar24;
  stKeyPressData<stSampleMulti<short,_4>_> *kp_1;
  size_type __n_00;
  pointer __args;
  pointer psVar25;
  long lVar26;
  bool bVar27;
  int iVar28;
  double dVar29;
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  TWaveformT<TSampleMI16> waveformAbs;
  vector<double,_std::allocator<double>_> rbSamples;
  long local_128;
  double local_120;
  stKeyPressData<stSampleMulti<short,_4>_> local_118;
  vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> local_e8;
  vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> *local_d0;
  int local_c4;
  _Deque_base<long,_std::allocator<long>_> local_c0;
  TWaveformT<TSampleMI16> *local_70;
  double local_68;
  vector<double,_std::allocator<double>_> local_60;
  TWaveformViewT<TSampleMI16> *local_48;
  long local_40;
  long local_38;
  undefined1 auVar30 [16];
  
  psVar25 = (res->
            super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
            ).
            super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((res->
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ).
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar25) {
    (res->
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ).
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar25;
  }
  local_d0 = waveformMax;
  local_c4 = historySizeReset;
  local_70 = waveformThreshold;
  local_68 = thresholdBackground;
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::resize
            (waveformThreshold,waveform->n);
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::resize
            (local_d0,waveform->n);
  local_c0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)(historySize * 8),(value_type_conflict5 *)&local_c0,
             (allocator_type *)&local_118);
  __n_00 = (size_type)historySize;
  std::deque<long,_std::allocator<long>_>::deque
            ((deque<long,_std::allocator<long>_> *)&local_c0,__n_00,(allocator_type *)&local_118);
  psVar4 = waveform->samples;
  __n = waveform->n;
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::vector
            (&local_e8,__n,(allocator_type *)&local_118);
  local_118.pos = (TKeyPressPosition)CONCAT44(local_118.pos._4_4_,(undefined4)local_118.pos);
  if (0 < (long)__n) {
    sVar16 = 0;
    do {
      sVar2 = psVar4[sVar16].super_array<short,_4UL>._M_elems[0];
      sVar3 = -sVar2;
      if (0 < sVar2) {
        sVar3 = sVar2;
      }
      local_e8.
      super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>._M_impl
      .super__Vector_impl_data._M_start[sVar16].super_array<short,_4UL>._M_elems[0] = sVar3;
      sVar16 = sVar16 + 1;
    } while (__n != sVar16);
    local_128 = 0;
    local_48 = waveform;
    local_118.pos = (TKeyPressPosition)CONCAT44(local_118.pos._4_4_,(undefined4)local_118.pos);
    if (0 < (long)__n) {
      local_38 = (long)(historySize * 2);
      local_40 = __n - local_38;
      local_120 = 0.0;
      iVar24 = 0;
      do {
        if (historySize / 2 <= local_128) {
          lVar13 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          auVar30._8_4_ =
               (int)((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 0x23);
          auVar30._0_8_ = lVar13;
          auVar30._12_4_ = 0x45300000;
          iVar28 = (int)lVar13;
          dVar32 = (auVar30._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,iVar28) - 4503599627370496.0);
          dVar33 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar24];
          dVar29 = (double)(int)local_e8.
                                super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_128].
                                super_array<short,_4UL>._M_elems[0];
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar24] = dVar29;
          local_120 = ((local_120 * dVar32 - dVar33) + dVar29) / dVar32;
          iVar24 = iVar24 + 1;
          if (iVar28 <= iVar24) {
            iVar24 = 0;
          }
        }
        plVar14 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_128 < (long)__n_00) {
          plVar17 = local_c0._M_impl.super__Deque_impl_data._M_start._M_cur;
          plVar14 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_first;
          if (local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_c0._M_impl.super__Deque_impl_data._M_start._M_cur) {
            do {
              plVar21 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur == plVar14) {
                plVar21 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              lVar13 = 0;
              do {
                sVar2 = *(short *)((long)local_e8.
                                         super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[local_128].
                                         super_array<short,_4UL>._M_elems + lVar13);
                sVar3 = *(short *)((long)local_e8.
                                         super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[plVar21[-1]].
                                         super_array<short,_4UL>._M_elems + lVar13);
                if (sVar2 < sVar3) goto LAB_0011cc82;
              } while ((sVar2 <= sVar3) && (bVar27 = lVar13 != 6, lVar13 = lVar13 + 2, bVar27));
              if (local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur == plVar14) {
                operator_delete(plVar14,0x200);
                plVar14 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                local_c0._M_impl.super__Deque_impl_data._M_finish._M_last = plVar14 + 0x40;
                local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur = plVar14 + 0x3f;
                plVar17 = local_c0._M_impl.super__Deque_impl_data._M_start._M_cur;
                local_c0._M_impl.super__Deque_impl_data._M_finish._M_first = plVar14;
                local_c0._M_impl.super__Deque_impl_data._M_finish._M_node =
                     local_c0._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
              }
              else {
                local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            } while (local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur != plVar17);
          }
LAB_0011cc82:
          if (local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_c0._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                      ((deque<long,std::allocator<long>> *)&local_c0,&local_128);
          }
          else {
            *local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur = local_128;
            local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        else {
          while (plVar14 != local_c0._M_impl.super__Deque_impl_data._M_start._M_cur) {
            if ((long)(local_128 - __n_00) <
                *local_c0._M_impl.super__Deque_impl_data._M_start._M_cur) {
              plVar18 = local_c0._M_impl.super__Deque_impl_data._M_start._M_cur;
              plVar17 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_first;
              if (plVar14 != local_c0._M_impl.super__Deque_impl_data._M_start._M_cur) {
                do {
                  plVar22 = plVar14;
                  if (plVar14 == plVar17) {
                    plVar22 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                  }
                  lVar13 = 0;
                  do {
                    sVar2 = *(short *)((long)local_e8.
                                             super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[local_128].
                                             super_array<short,_4UL>._M_elems + lVar13);
                    sVar3 = *(short *)((long)local_e8.
                                             super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[plVar22[-1]].
                                             super_array<short,_4UL>._M_elems + lVar13);
                    if (sVar2 < sVar3) goto LAB_0011ce02;
                  } while ((sVar2 <= sVar3) && (bVar27 = lVar13 != 6, lVar13 = lVar13 + 2, bVar27));
                  if (plVar14 == plVar17) {
                    operator_delete(plVar17,0x200);
                    plVar17 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                    local_c0._M_impl.super__Deque_impl_data._M_finish._M_last = plVar17 + 0x40;
                    plVar14 = plVar17 + 0x3f;
                    plVar18 = local_c0._M_impl.super__Deque_impl_data._M_start._M_cur;
                    local_c0._M_impl.super__Deque_impl_data._M_finish._M_first = plVar17;
                    local_c0._M_impl.super__Deque_impl_data._M_finish._M_node =
                         local_c0._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
                  }
                  else {
                    plVar14 = plVar14 + -1;
                  }
                  local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur = plVar14;
                } while (plVar14 != plVar18);
              }
              break;
            }
            if (local_c0._M_impl.super__Deque_impl_data._M_start._M_cur ==
                local_c0._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
              operator_delete(local_c0._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
              local_c0._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_c0._M_impl.super__Deque_impl_data._M_start._M_node[1];
              local_c0._M_impl.super__Deque_impl_data._M_start._M_last =
                   local_c0._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
              plVar14 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur;
              local_c0._M_impl.super__Deque_impl_data._M_start._M_first =
                   local_c0._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_c0._M_impl.super__Deque_impl_data._M_start._M_node =
                   local_c0._M_impl.super__Deque_impl_data._M_start._M_node + 1;
            }
            else {
              local_c0._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_c0._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
            }
          }
LAB_0011ce02:
          if (plVar14 == local_c0._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                      ((deque<long,std::allocator<long>> *)&local_c0,&local_128);
          }
          else {
            *plVar14 = local_128;
            local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur = plVar14 + 1;
          }
          psVar25 = (pointer)(local_128 - historySize / 2);
          if ((((long)psVar25 < local_40 && local_38 <= (long)psVar25) &&
              ((pointer)*local_c0._M_impl.super__Deque_impl_data._M_start._M_cur == psVar25)) &&
             (local_120 * local_68 <
              (double)(int)local_e8.
                           super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)psVar25].
                           super_array<short,_4UL>._M_elems[0])) {
            local_118.waveform.samples = local_48->samples;
            iVar9 = local_48->n;
            local_118.waveform.n._0_4_ = (undefined4)iVar9;
            local_118.waveform.n._4_4_ = (undefined4)((ulong)iVar9 >> 0x20);
            local_118.ccAvg._0_4_ = 0;
            local_118.ccAvg._4_4_ = 0;
            local_118.cid = -1;
            local_118.bind = -1;
            local_118.predicted = 0x3f;
            iVar5._M_current =
                 (res->
                 super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                 ).
                 super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_118.pos = (TKeyPressPosition)psVar25;
            if (iVar5._M_current ==
                (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
              ::_M_realloc_insert<stKeyPressData<stSampleMulti<short,4>>>
                        ((vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
                          *)res,iVar5,&local_118);
            }
            else {
              (iVar5._M_current)->cid = -1;
              (iVar5._M_current)->bind = -1;
              *(ulong *)&(iVar5._M_current)->predicted = CONCAT44(local_118._44_4_,0x3f);
              (iVar5._M_current)->pos = (TKeyPressPosition)psVar25;
              (iVar5._M_current)->ccAvg = 0.0;
              ((iVar5._M_current)->waveform).samples = local_118.waveform.samples;
              ((iVar5._M_current)->waveform).n = iVar9;
              ppsVar1 = &(res->
                         super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ).
                         super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppsVar1 = *ppsVar1 + 1;
            }
          }
          (local_70->
          super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>).
          _M_impl.super__Vector_impl_data._M_start[(long)psVar25].super_array<short,_4UL>._M_elems
          [0] = (short)(int)(local_120 * local_68);
          *(undefined8 *)
           (local_d0->
           super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start[(long)psVar25].super_array<short,_4UL>._M_elems
               = *(undefined8 *)
                  local_e8.
                  super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*local_c0._M_impl.super__Deque_impl_data._M_start._M_cur].super_array<short,_4UL>
                  ._M_elems;
        }
        local_128 = local_128 + 1;
      } while (local_128 < (long)__n);
    }
  }
  if (removeLowPower) {
    do {
      psVar25 = (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar15 = (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar15 == psVar25) {
        psVar19 = (res->
                  super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ).
                  super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (res->
        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ).
        super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (res->
        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ).
        super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (res->
        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ).
        super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0011d08a:
        lVar13 = 0;
      }
      else {
        lVar13 = ((long)psVar15 - (long)psVar25 >> 4) * -0x5555555555555555;
        dVar33 = 0.0;
        psVar19 = psVar25;
        do {
          dVar33 = dVar33 + (double)(int)local_e8.
                                         super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[psVar19->pos].
                                         super_array<short,_4UL>._M_elems[0];
          psVar19 = psVar19 + 1;
        } while (psVar19 != psVar15);
        psVar19 = (res->
                  super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ).
                  super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (res->
        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ).
        super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (res->
        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ).
        super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (res->
        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ).
        super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (psVar25 == psVar15) goto LAB_0011d08a;
        auVar31._8_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar31._0_8_ = lVar13;
        auVar31._12_4_ = 0x45300000;
        local_120 = (dVar33 / ((auVar31._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0))) *
                    0.3;
        __args = psVar25;
        do {
          if (local_120 <
              (double)(int)local_e8.
                           super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[__args->pos].
                           super_array<short,_4UL>._M_elems[0]) {
            iVar5._M_current =
                 (res->
                 super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                 ).
                 super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
              ::_M_realloc_insert<stKeyPressData<stSampleMulti<short,4>>const&>
                        ((vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
                          *)res,iVar5,__args);
            }
            else {
              psVar4 = (__args->waveform).samples;
              iVar9 = (__args->waveform).n;
              TVar7 = __args->pos;
              TVar8 = __args->ccAvg;
              TVar10 = __args->bind;
              TVar11 = __args->predicted;
              uVar12 = *(undefined4 *)&__args->field_0x2c;
              (iVar5._M_current)->cid = __args->cid;
              (iVar5._M_current)->bind = TVar10;
              (iVar5._M_current)->predicted = TVar11;
              *(undefined4 *)&(iVar5._M_current)->field_0x2c = uVar12;
              (iVar5._M_current)->pos = TVar7;
              (iVar5._M_current)->ccAvg = TVar8;
              ((iVar5._M_current)->waveform).samples = psVar4;
              ((iVar5._M_current)->waveform).n = iVar9;
              ppsVar1 = &(res->
                         super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ).
                         super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppsVar1 = *ppsVar1 + 1;
            }
          }
          __args = __args + 1;
        } while (__args != psVar15);
        lVar13 = (long)(res->
                       super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                       ).
                       super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(res->
                       super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                       ).
                       super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      }
      if (psVar25 != (pointer)0x0) {
        operator_delete(psVar25,(long)psVar19 - (long)psVar25);
      }
    } while (lVar13 != (long)psVar15 - (long)psVar25);
  }
  psVar20 = (res->
            super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
            ).
            super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(res->
                         super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ).
                         super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar20 >> 4) *
                 -0x5555555555555555)) {
    local_118.pos._0_4_ = 0;
    local_118.pos._4_4_ = 0;
    local_118.ccAvg._0_4_ = 0;
    local_118.waveform.samples = (stSampleMulti<short,_4> *)0x0;
    local_118.waveform.n._0_4_ = 0;
    local_118.waveform.n._4_4_ = 0;
    std::
    vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
    ::_M_realloc_insert<stKeyPressData<stSampleMulti<short,4>>const&>
              ((vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
                *)&local_118,(iterator)0x0,psVar20);
    psVar25 = (res->
              super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ).
              super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar15 = (res->
              super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ).
              super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (1 < (int)((ulong)((long)psVar15 - (long)psVar25) >> 4) * -0x55555555) {
      lVar26 = (long)local_c4;
      lVar13 = 1;
      do {
        if (lVar26 < psVar25[lVar13].pos -
                     ((stKeyPressData<stSampleMulti<short,_4>_> *)(local_118.waveform.n + -0x30))->
                     pos) {
LAB_0011d139:
          psVar20 = psVar25 + lVar13;
          if ((stKeyPressData<stSampleMulti<short,_4>_> *)local_118.waveform.n ==
              (stKeyPressData<stSampleMulti<short,_4>_> *)
              CONCAT44(local_118.pos._4_4_,(undefined4)local_118.pos)) {
            std::
            vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
            ::_M_realloc_insert<stKeyPressData<stSampleMulti<short,4>>const&>
                      ((vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
                        *)&local_118,(iterator)local_118.waveform.n,psVar20);
          }
          else {
            psVar4 = (psVar20->waveform).samples;
            iVar9 = (psVar20->waveform).n;
            TVar7 = psVar20->pos;
            TVar8 = psVar20->ccAvg;
            TVar10 = psVar20->bind;
            TVar11 = psVar20->predicted;
            uVar12 = *(undefined4 *)&psVar20->field_0x2c;
            ((stKeyPressData<stSampleMulti<short,_4>_> *)local_118.waveform.n)->cid = psVar20->cid;
            ((stKeyPressData<stSampleMulti<short,_4>_> *)local_118.waveform.n)->bind = TVar10;
            ((stKeyPressData<stSampleMulti<short,_4>_> *)local_118.waveform.n)->predicted = TVar11;
            *(undefined4 *)
             &((stKeyPressData<stSampleMulti<short,_4>_> *)local_118.waveform.n)->field_0x2c =
                 uVar12;
            ((stKeyPressData<stSampleMulti<short,_4>_> *)local_118.waveform.n)->pos = TVar7;
            ((stKeyPressData<stSampleMulti<short,_4>_> *)local_118.waveform.n)->ccAvg = TVar8;
            (((stKeyPressData<stSampleMulti<short,_4>_> *)local_118.waveform.n)->waveform).samples =
                 psVar4;
            (((stKeyPressData<stSampleMulti<short,_4>_> *)local_118.waveform.n)->waveform).n = iVar9
            ;
            local_118.waveform.n = local_118.waveform.n + 0x30;
          }
        }
        else {
          psVar6 = (local_d0->
                   super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar23 = 0;
          do {
            sVar2 = *(short *)((long)psVar6[((stKeyPressData<stSampleMulti<short,_4>_> *)
                                            (local_118.waveform.n + -0x30))->pos].
                                     super_array<short,_4UL>._M_elems + lVar23);
            sVar3 = *(short *)((long)psVar6[psVar25[lVar13].pos].super_array<short,_4UL>._M_elems +
                              lVar23);
            if (sVar2 < sVar3) goto LAB_0011d139;
          } while ((sVar2 <= sVar3) && (bVar27 = lVar23 != 6, lVar23 = lVar23 + 2, bVar27));
        }
        lVar13 = lVar13 + 1;
        psVar25 = (res->
                  super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ).
                  super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar15 = (res->
                  super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ).
                  super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (lVar13 < (int)((ulong)((long)psVar15 - (long)psVar25) >> 4) * -0x55555555);
    }
    psVar19 = (res->
              super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ).
              super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar24 = res->nClusters;
    (res->
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ).
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_118.waveform.samples;
    (res->
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ).
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_118.waveform.n;
    (res->
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ).
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_118.pos._4_4_,(undefined4)local_118.pos);
    res->nClusters = local_118.ccAvg._0_4_;
    local_118.waveform.n._0_4_ = SUB84(psVar15,0);
    local_118.waveform.n._4_4_ = (undefined4)((ulong)psVar15 >> 0x20);
    local_118.waveform.samples = (stSampleMulti<short,_4> *)psVar25;
    local_118.ccAvg._0_4_ = iVar24;
    local_118.pos = (TKeyPressPosition)psVar19;
    if (psVar25 != (pointer)0x0) {
      operator_delete(psVar25,(long)psVar19 - (long)psVar25);
    }
  }
  if (local_e8.
      super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_c0);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool findKeyPresses(
        const TWaveformViewT<TSampleMI16> & waveform,
        TKeyPressCollectionT<TSampleMI16> & res,
        TWaveformT<TSampleMI16> & waveformThreshold,
        TWaveformT<TSampleMI16> & waveformMax,
        double thresholdBackground,
        int historySize,
        int historySizeReset,
        bool removeLowPower) {
    res.clear();
    waveformThreshold.resize(waveform.n);
    waveformMax.resize(waveform.n);

    int rbBegin = 0;
    double rbAverage = 0.0;
    std::vector<double> rbSamples(8*historySize, 0.0);

    int k = historySize;
    std::deque<int64_t> que(k);

    auto samples = waveform.samples;
    auto n       = waveform.n;

    TWaveformT<TSampleMI16> waveformAbs(n);
    for (int64_t i = 0; i < n; ++i) {
        waveformAbs[i][0] = std::abs(samples[i][0]);
    }

    for (int64_t i = 0; i < n; ++i) {
        {
            int64_t ii = i - k/2;
            if (ii >= 0) {
                rbAverage *= rbSamples.size();
                rbAverage -= rbSamples[rbBegin];
                double acur = waveformAbs[i][0];
                rbSamples[rbBegin] = acur;
                rbAverage += acur;
                rbAverage /= rbSamples.size();
                if (++rbBegin >= (int) rbSamples.size()) {
                    rbBegin = 0;
                }
            }
        }

        if (i < k) {
            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }
            que.push_back(i);
        } else {
            while((!que.empty()) && que.front() <= i - k) {
                que.pop_front();
            }

            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }

            que.push_back(i);

            int64_t itest = i - k/2;
            if (itest >= 2*k && itest < n - 2*k && que.front() == itest) {
                double acur = waveformAbs[itest][0];
                if (acur > thresholdBackground*rbAverage) {
                    res.emplace_back(TKeyPressDataT<TSampleMI16> { std::move(waveform), itest, 0.0, -1, -1, '?' });
                }
            }
            waveformThreshold[itest][0] = thresholdBackground*rbAverage;
            waveformMax[itest] = waveformAbs[que.front()];
        }
    }

    if (removeLowPower) {
        while (true) {
            auto oldn = res.size();

            double avgPower = 0.0;
            for (const auto & kp : res) {
                avgPower += waveformAbs[kp.pos][0];
            }
            avgPower /= res.size();

            auto tmp = std::move(res);
            for (const auto & kp : tmp) {
                if (waveformAbs[kp.pos][0] > 0.3*avgPower) {
                    res.push_back(kp);
                }
            }

            if (res.size() == oldn) break;
        }
    }

    if (res.size() > 1) {
        TKeyPressCollectionT<TSampleMI16> res2;
        res2.push_back(res.front());

        for (int i = 1; i < (int) res.size(); ++i) {
            if (res[i].pos - res2.back().pos > historySizeReset || waveformMax[res[i].pos] > waveformMax[res2.back().pos]) {
                res2.push_back(res[i]);
            }
        }

        std::swap(res, res2);
    }

    return true;
}